

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_avx2_256_32.c
# Opt level: O3

parasail_result_t *
parasail_sw_striped_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  __m256i c;
  int iVar8;
  parasail_result_t *result;
  __m256i *b;
  __m256i *palVar9;
  __m256i *palVar10;
  __m256i *b_00;
  ulong uVar11;
  int iVar12;
  ulong uVar13;
  __m256i *ptr;
  ulong uVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  __m256i *palVar20;
  undefined1 auVar21 [32];
  undefined1 auVar22 [64];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [64];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined8 in_stack_ffffffffffffff38;
  uint uVar31;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 uVar32;
  undefined1 auVar25 [64];
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_striped_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar2 = (profile->profile32).score;
    if (pvVar2 == (void *)0x0) {
      parasail_sw_striped_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_sw_striped_profile_avx2_256_32_cold_6();
      }
      else {
        uVar17 = profile->s1Len;
        if ((int)uVar17 < 1) {
          parasail_sw_striped_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_striped_profile_avx2_256_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_striped_profile_avx2_256_32_cold_3();
        }
        else if (open < 0) {
          parasail_sw_striped_profile_avx2_256_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_striped_profile_avx2_256_32_cold_1();
        }
        else {
          iVar8 = ppVar3->max;
          result = parasail_result_new();
          if (result != (parasail_result_t *)0x0) {
            uVar32 = 0;
            uVar11 = (ulong)uVar17 + 7;
            uVar13 = uVar11 >> 3;
            result->flag = result->flag | 0x8400804;
            b = parasail_memalign___m256i(0x20,uVar13);
            palVar9 = parasail_memalign___m256i(0x20,uVar13);
            palVar10 = parasail_memalign___m256i(0x20,uVar13);
            b_00 = parasail_memalign___m256i(0x20,uVar13);
            if ((b_00 != (__m256i *)0x0 && palVar10 != (__m256i *)0x0) &&
                (palVar9 != (__m256i *)0x0 && b != (__m256i *)0x0)) {
              alVar1[1]._0_4_ = open;
              alVar1[0] = in_stack_ffffffffffffff38;
              alVar1[1]._4_4_ = in_stack_ffffffffffffff44;
              alVar1[2] = (longlong)result;
              alVar1[3]._0_4_ = s2Len;
              alVar1[3]._4_4_ = uVar32;
              iVar12 = open;
              parasail_memset___m256i(b,alVar1,uVar13);
              c[1]._0_4_ = iVar12;
              c[0] = in_stack_ffffffffffffff38;
              c[1]._4_4_ = in_stack_ffffffffffffff44;
              c[2] = (longlong)result;
              c[3]._0_4_ = s2Len;
              c[3]._4_4_ = uVar32;
              parasail_memset___m256i(b_00,c,uVar13);
              auVar7._4_4_ = gap;
              auVar7._0_4_ = gap;
              auVar7._8_4_ = gap;
              auVar7._12_4_ = gap;
              auVar7._16_4_ = gap;
              auVar7._20_4_ = gap;
              auVar7._24_4_ = gap;
              auVar7._28_4_ = gap;
              auVar6._4_4_ = open;
              auVar6._0_4_ = open;
              auVar6._8_4_ = open;
              auVar6._12_4_ = open;
              auVar6._16_4_ = open;
              auVar6._20_4_ = open;
              auVar6._24_4_ = open;
              auVar6._28_4_ = open;
              uVar19 = 0;
              uVar31 = (uint)uVar13;
              iVar12 = -0x40000000;
              auVar23._8_4_ = 0xc0000000;
              auVar23._0_8_ = 0xc0000000c0000000;
              auVar23._12_4_ = 0xc0000000;
              auVar23._16_4_ = 0xc0000000;
              auVar23._20_4_ = 0xc0000000;
              auVar23._24_4_ = 0xc0000000;
              auVar23._28_4_ = 0xc0000000;
              auVar25 = ZEXT3264(auVar23);
              uVar14 = 0;
              auVar22 = ZEXT3264(auVar23);
              do {
                ptr = b;
                iVar16 = ppVar3->mapper[(byte)s2[uVar14]];
                uVar15 = (uint)uVar14;
                palVar20 = palVar10;
                b = palVar9;
                if (uVar19 == uVar15 - 2) {
                  palVar20 = palVar9;
                  b = palVar10;
                }
                alVar1 = ptr[uVar31 - 1];
                auVar23 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
                auVar23 = vpalignr_avx2((undefined1  [32])alVar1,auVar23,0xc);
                lVar18 = 0;
                auVar28 = ZEXT1664((undefined1  [16])0x0);
                do {
                  auVar26 = vpaddd_avx2(auVar23,*(undefined1 (*) [32])
                                                 ((long)pvVar2 +
                                                 lVar18 + (long)iVar16 * uVar13 * 0x20));
                  auVar23 = *(undefined1 (*) [32])((long)*b_00 + lVar18);
                  auVar21 = vpmaxsd_avx2(auVar23,auVar28._0_32_);
                  auVar26 = vpmaxsd_avx2(auVar26,auVar21);
                  auVar26 = vpmaxsd_avx2(auVar26,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
                  *(undefined1 (*) [32])((long)*b + lVar18) = auVar26;
                  auVar21 = vpmaxsd_avx2(auVar26,auVar22._0_32_);
                  auVar22 = ZEXT3264(auVar21);
                  auVar26 = vpsubd_avx2(auVar26,auVar6);
                  auVar23 = vpsubd_avx2(auVar23,auVar7);
                  auVar23 = vpmaxsd_avx2(auVar23,auVar26);
                  *(undefined1 (*) [32])((long)*b_00 + lVar18) = auVar23;
                  auVar23 = vpsubd_avx2(auVar28._0_32_,auVar7);
                  auVar23 = vpmaxsd_avx2(auVar23,auVar26);
                  auVar28 = ZEXT3264(auVar23);
                  auVar23 = *(undefined1 (*) [32])((long)*ptr + lVar18);
                  lVar18 = lVar18 + 0x20;
                } while (uVar13 << 5 != lVar18);
                iVar16 = 0;
                do {
                  auVar26 = auVar28._0_32_;
                  auVar23 = vperm2i128_avx2(auVar26,auVar26,8);
                  auVar23 = vpalignr_avx2(auVar26,auVar23,0xc);
                  auVar28 = ZEXT3264(auVar23);
                  lVar18 = 0;
                  do {
                    auVar23 = vpmaxsd_avx2(auVar28._0_32_,*(undefined1 (*) [32])((long)*b + lVar18))
                    ;
                    *(undefined1 (*) [32])((long)*b + lVar18) = auVar23;
                    auVar26 = vpmaxsd_avx2(auVar23,auVar22._0_32_);
                    auVar22 = ZEXT3264(auVar26);
                    auVar23 = vpsubd_avx2(auVar23,auVar6);
                    auVar21 = vpsubd_avx2(auVar28._0_32_,auVar7);
                    auVar28 = ZEXT3264(auVar21);
                    auVar23 = vpcmpgtd_avx2(auVar21,auVar23);
                    if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                             (auVar23 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                            (auVar23 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                           SUB321(auVar23 >> 0x7f,0) == '\0') &&
                          (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                         SUB321(auVar23 >> 0xbf,0) == '\0') &&
                        (auVar23 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
                        -1 < auVar23[0x1f]) goto LAB_00774f55;
                    lVar18 = lVar18 + 0x20;
                  } while (uVar13 << 5 != lVar18);
                  iVar16 = iVar16 + 1;
                } while (iVar16 != 8);
LAB_00774f55:
                auVar23 = vpcmpgtd_avx2(auVar26,auVar25._0_32_);
                if ((((((((auVar23 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                         (auVar23 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        (auVar23 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       SUB321(auVar23 >> 0x7f,0) != '\0') ||
                      (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     SUB321(auVar23 >> 0xbf,0) != '\0') ||
                    (auVar23 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    auVar23[0x1f] < '\0') {
                  auVar23 = vpermq_avx2(auVar26,0x44);
                  auVar23 = vpmaxsd_avx2(auVar26,auVar23);
                  auVar26 = vpslldq_avx2(auVar23,8);
                  auVar23 = vpmaxsd_avx2(auVar23,auVar26);
                  auVar26 = vpslldq_avx2(auVar23,4);
                  auVar23 = vpmaxsd_avx2(auVar23,auVar26);
                  iVar12 = auVar23._28_4_;
                  if (0x7ffffffe - iVar8 < iVar12) {
                    *(byte *)&result->flag = (byte)result->flag | 0x40;
                    s2Len = uVar15;
                    break;
                  }
                  auVar26._8_4_ = 7;
                  auVar26._0_8_ = 0x700000007;
                  auVar26._12_4_ = 7;
                  auVar26._16_4_ = 7;
                  auVar26._20_4_ = 7;
                  auVar26._24_4_ = 7;
                  auVar26._28_4_ = 7;
                  auVar23 = vpermd_avx2(auVar26,auVar23);
                  auVar25 = ZEXT3264(auVar23);
                  uVar19 = uVar15;
                }
                uVar14 = uVar14 + 1;
                palVar9 = ptr;
                palVar10 = palVar20;
              } while (uVar14 != (uint)s2Len);
              if (iVar12 == 0x7fffffff) {
                *(byte *)&result->flag = (byte)result->flag | 0x40;
              }
              iVar8 = parasail_result_is_saturated(result);
              palVar9 = palVar20;
              if (iVar8 == 0) {
                palVar10 = ptr;
                if (uVar19 == s2Len - 2U) {
                  palVar9 = ptr;
                  palVar10 = palVar20;
                }
                if (uVar19 == s2Len - 1U) {
                  palVar9 = b;
                  b = palVar20;
                  palVar10 = ptr;
                }
                ptr = palVar10;
                uVar17 = uVar17 - 1;
                if ((uVar11 & 0x7ffffff8) != 0) {
                  if ((uVar11 & 0x7ffffff8) == 0) {
                    uVar11 = 0;
                    do {
                      if ((*(int *)((long)*palVar9 + uVar11 * 4) == iVar12) &&
                         (uVar15 = ((uint)uVar11 & 7) * uVar31 | (uint)(uVar11 >> 3) & 0x1fffffff,
                         (int)uVar15 < (int)uVar17)) {
                        uVar17 = uVar15;
                      }
                      uVar11 = uVar11 + 1;
                    } while ((uVar31 & 0xfffffff) << 3 != (int)uVar11);
                  }
                  else {
                    auVar21._4_4_ = uVar17;
                    auVar21._0_4_ = uVar17;
                    auVar21._8_4_ = uVar17;
                    auVar21._12_4_ = uVar17;
                    auVar21._16_4_ = uVar17;
                    auVar21._20_4_ = uVar17;
                    auVar21._24_4_ = uVar17;
                    auVar21._28_4_ = uVar17;
                    auVar24._4_4_ = iVar12;
                    auVar24._0_4_ = iVar12;
                    auVar24._8_4_ = iVar12;
                    auVar24._12_4_ = iVar12;
                    auVar24._16_4_ = iVar12;
                    auVar24._20_4_ = iVar12;
                    auVar24._24_4_ = iVar12;
                    auVar24._28_4_ = iVar12;
                    auVar27._4_4_ = uVar31;
                    auVar27._0_4_ = uVar31;
                    auVar27._8_4_ = uVar31;
                    auVar27._12_4_ = uVar31;
                    auVar27._16_4_ = uVar31;
                    auVar27._20_4_ = uVar31;
                    auVar27._24_4_ = uVar31;
                    auVar27._28_4_ = uVar31;
                    auVar7 = vpmovsxbd_avx2(ZEXT816(0x706050403020100));
                    uVar13 = 0;
                    auVar29._8_4_ = 7;
                    auVar29._0_8_ = 0x700000007;
                    auVar29._12_4_ = 7;
                    auVar29._16_4_ = 7;
                    auVar29._20_4_ = 7;
                    auVar29._24_4_ = 7;
                    auVar29._28_4_ = 7;
                    auVar30._8_4_ = 8;
                    auVar30._0_8_ = 0x800000008;
                    auVar30._12_4_ = 8;
                    auVar30._16_4_ = 8;
                    auVar30._20_4_ = 8;
                    auVar30._24_4_ = 8;
                    auVar30._28_4_ = 8;
                    do {
                      auVar23 = vpcmpeqd_avx2(auVar24,*(undefined1 (*) [32])
                                                       ((long)*palVar9 + uVar13 * 4));
                      auVar26 = vpsrld_avx2(auVar7,3);
                      auVar6 = vpand_avx2(auVar7,auVar29);
                      auVar6 = vpmulld_avx2(auVar6,auVar27);
                      auVar6 = vpaddd_avx2(auVar6,auVar26);
                      auVar6 = vpminsd_avx2(auVar6,auVar21);
                      auVar21 = vblendvps_avx(auVar21,auVar6,auVar23);
                      uVar13 = uVar13 + 8;
                      auVar7 = vpaddd_avx2(auVar7,auVar30);
                    } while (((uint)uVar11 & 0x7ffffff8) != uVar13);
                    auVar4 = vpminsd_avx(auVar21._0_16_,auVar21._16_16_);
                    auVar5 = vpshufd_avx(auVar4,0xee);
                    auVar4 = vpminsd_avx(auVar4,auVar5);
                    auVar5 = vpshufd_avx(auVar4,0x55);
                    auVar4 = vpminsd_avx(auVar4,auVar5);
                    uVar17 = auVar4._0_4_;
                  }
                }
              }
              else {
                uVar19 = 0;
                iVar12 = 0x7fffffff;
                uVar17 = 0;
              }
              result->score = iVar12;
              result->end_query = uVar17;
              result->end_ref = uVar19;
              parasail_free(b_00);
              parasail_free(palVar9);
              parasail_free(ptr);
              parasail_free(b);
              return result;
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict vProfile = NULL;
    __m256i* restrict pvHStore = NULL;
    __m256i* restrict pvHLoad = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvE = NULL;
    __m256i vGapO;
    __m256i vGapE;
    __m256i vZero;
    __m256i vNegInf;
    int32_t score = 0;
    __m256i vMaxH;
    __m256i vMaxHUnit;
    int32_t maxp = 0;
    /*int32_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m256i*)profile->profile32.score;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    vZero = _mm256_setzero_si256();
    vNegInf = _mm256_set1_epi32(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT32_MAX - (int32_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT32_MAX : (int32_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m256i(32, segLen);
    pvHLoad =  parasail_memalign___m256i(32, segLen);
    pvHMax = parasail_memalign___m256i(32, segLen);
    pvE = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m256i(pvHStore, vZero, segLen);
    parasail_memset___m256i(pvE, _mm256_set1_epi32(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vF;
        __m256i vH;
        const __m256i* vP = NULL;
        __m256i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 4 bytes */
        vH = _mm256_load_si256(&pvHStore[segLen - 1]);
        vH = _mm256_slli_si256_rpl(vH, 4);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm256_add_epi32(vH, _mm256_load_si256(vP + i));
            vE = _mm256_load_si256(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm256_max_epi32(vH, vE);
            vH = _mm256_max_epi32(vH, vF);
            vH = _mm256_max_epi32(vH, vZero);
            /* Save vH values. */
            _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm256_max_epi32(vH, vMaxH);

            /* Update vE value. */
            vH = _mm256_sub_epi32(vH, vGapO);
            vE = _mm256_sub_epi32(vE, vGapE);
            vE = _mm256_max_epi32(vE, vH);
            _mm256_store_si256(pvE + i, vE);

            /* Update vF value. */
            vF = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm256_load_si256(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm256_slli_si256_rpl(vF, 4);
            for (i=0; i<segLen; ++i) {
                vH = _mm256_load_si256(pvHStore + i);
                vH = _mm256_max_epi32(vH,vF);
                _mm256_store_si256(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si256(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm256_max_epi32(vH, vMaxH);
                vH = _mm256_sub_epi32(vH, vGapO);
                vF = _mm256_sub_epi32(vF, vGapE);
                if (! _mm256_movemask_epi8(_mm256_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm256_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm256_load_si256(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
        }
#endif

        {
            __m256i vCompare = _mm256_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi32_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm256_set1_epi32(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT32_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT32_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m256i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m256i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int32_t *t = (int32_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}